

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O0

uint32_t upb_Message_WhichOneofFieldNumber(upb_Message *message,upb_MiniTableField *oneof_field)

{
  _Bool _Var1;
  uint32_t uVar2;
  upb_MiniTableField *oneof_field_local;
  upb_Message *message_local;
  
  _Var1 = upb_MiniTableField_IsInOneof(oneof_field);
  if (!_Var1) {
    __assert_fail("upb_MiniTableField_IsInOneof(oneof_field)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x79,
                  "uint32_t upb_Message_WhichOneofFieldNumber(const struct upb_Message *, const upb_MiniTableField *)"
                 );
  }
  uVar2 = _upb_Message_GetOneofCase_dont_copy_me__upb_internal_use_only(message,oneof_field);
  return uVar2;
}

Assistant:

UPB_API_INLINE uint32_t upb_Message_WhichOneofFieldNumber(
    const struct upb_Message* message, const upb_MiniTableField* oneof_field) {
  UPB_ASSUME(upb_MiniTableField_IsInOneof(oneof_field));
  return UPB_PRIVATE(_upb_Message_GetOneofCase)(message, oneof_field);
}